

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_stop_here.cpp
# Opt level: O3

void sc_core::sc_interrupt_here(char *id,sc_severity severity)

{
  undefined8 *puVar1;
  
  if (severity < SC_FATAL) {
    puVar1 = (undefined8 *)(&PTR_info_id_0026eec0)[severity];
  }
  else {
    puVar1 = &fatal_id;
  }
  *puVar1 = id;
  return;
}

Assistant:

void
sc_interrupt_here( const char* id, sc_severity severity )
{
    // you can set a breakpoint at some of the lines below, either to
    // interrupt with any severity, or to interrupt with a specific severity

    switch( severity ) {
      case SC_INFO: 
	info_id = id;
	break;
      case SC_WARNING: 
	warning_id = id;
	break;
      case SC_ERROR: 
	error_id = id;
	break;
      default:
      case SC_FATAL: 
	fatal_id = id;
	break;
    }
}